

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O1

void Js::JavascriptExceptionObject::Remove(Type *head,JavascriptExceptionObject *item)

{
  JavascriptExceptionObject *pJVar1;
  code *pcVar2;
  JavascriptExceptionObject *pJVar3;
  undefined4 *puVar4;
  bool bVar5;
  
  pJVar1 = head->ptr;
  bVar5 = pJVar1 == (JavascriptExceptionObject *)0x0;
  if (!bVar5) {
    if (pJVar1 != item) {
      do {
        pJVar3 = pJVar1;
        pJVar1 = (pJVar3->next).ptr;
        bVar5 = pJVar1 == (JavascriptExceptionObject *)0x0;
        if (bVar5) goto LAB_00aa1b5b;
      } while (pJVar1 != item);
      head = &pJVar3->next;
    }
    pJVar1 = (item->next).ptr;
    Memory::Recycler::WBSetBit((char *)head);
    head->ptr = pJVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(head);
    (item->next).ptr = (JavascriptExceptionObject *)0x0;
    if (!bVar5) {
      return;
    }
  }
LAB_00aa1b5b:
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                              ,0xfe,"(false)","false");
  if (bVar5) {
    *puVar4 = 0;
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void JavascriptExceptionObject::Remove(
        Field(JavascriptExceptionObject*)* head, JavascriptExceptionObject* item)
    {
        // Typically Insert/Remove happens in reversed order and item should be
        // the front one. Loop the whole list to prevent unexpected order messup.
        for (auto p = head; *p; p = &(*p)->next)
        {
            if (*p == item)
            {
                *p = item->next;
                item->next = nullptr;
                return;
            }
        }

        Assert(false);  // item not in list unexpected
    }